

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_protobuf.h
# Opt level: O1

bool __thiscall
ec::base_protobuf::jump_over(base_protobuf *this,uint8_t **pd,int *len,uint32_t wire_type)

{
  bool bVar1;
  int iVar2;
  size_t datalen;
  uint64_t v;
  unsigned_long local_20 [2];
  
  local_20[0] = 0;
  local_20[1] = 0;
  switch(wire_type) {
  case 0:
    bVar1 = get_varint<unsigned_long,void>(this,pd,len,local_20 + 1);
    return bVar1;
  case 1:
    iVar2 = *len;
    if (7 < iVar2) {
      *pd = *pd + 8;
      iVar2 = iVar2 + -8;
LAB_0010e266:
      *len = iVar2;
      return true;
    }
    break;
  case 2:
    bVar1 = get_varint<unsigned_long,void>(this,pd,len,local_20);
    if ((bVar1) && (iVar2 = *len - (int)local_20[0], (int)local_20[0] <= *len)) {
      *pd = *pd + local_20[0];
      goto LAB_0010e266;
    }
    break;
  default:
    this->_lasterr = 2;
    break;
  case 5:
    iVar2 = *len;
    if (3 < iVar2) {
      *pd = *pd + 4;
      iVar2 = iVar2 + -4;
      goto LAB_0010e266;
    }
  }
  return false;
}

Assistant:

bool jump_over(const uint8_t *&pd, int &len, uint32_t wire_type) //jump over unkown field_number
    {
        size_t datalen = 0;
        uint64_t v = 0;

        switch (wire_type) {
        case pb_varint:
            return get_varint(pd, len, v);
            break;

        case pb_fixed64:
            if (len < 8) {
                return false;
            }

            pd += 8;
            len -= 8;
            break;

        case pb_length_delimited:
            if (!get_varint(pd, len, datalen)) {
                return false;
            }

            if (len < (int)datalen) {
                return false;
            }

            pd += datalen;
            len -= (int)datalen;
            break;

        case pb_fixed32:
            if (len < 4) {
                return false;
            }

            pd += 4;
            len -= 4;
            break;

        default:
            _lasterr = pberr_decode;
            return false;// unkown wire_type
        }

        return true;
    }